

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cpp
# Opt level: O2

void __thiscall polyscope::PointCloud::buildPickUI(PointCloud *this,size_t localPickID)

{
  _Base_ptr p_Var1;
  vec3 *v;
  float fVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::to_string(&local_38,localPickID);
  std::operator+(&local_58,"#",&local_38);
  std::operator+(&local_78,&local_58,"  ");
  ImGui::TextUnformatted(local_78._M_dataplus._M_p,(char *)0x0);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  ImGui::SameLine(0.0,-1.0);
  to_string_abi_cxx11_
            (&local_78,
             (polyscope *)
             ((this->points).
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + localPickID),v);
  ImGui::TextUnformatted(local_78._M_dataplus._M_p,(char *)0x0);
  std::__cxx11::string::~string((string *)&local_78);
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Indent(20.0);
  ImGui::Columns(2,(char *)0x0,true);
  fVar2 = ImGui::GetWindowWidth();
  ImGui::SetColumnWidth(0,fVar2 / 3.0);
  for (p_Var1 = (this->super_QuantityStructure<polyscope::PointCloud>).quantities._M_t._M_impl.
                super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 !=
      &(this->super_QuantityStructure<polyscope::PointCloud>).quantities._M_t._M_impl.
       super__Rb_tree_header; p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    (**(code **)(**(long **)(p_Var1 + 2) + 0x28))(*(long **)(p_Var1 + 2),localPickID);
  }
  ImGui::Indent(-20.0);
  return;
}

Assistant:

void PointCloud::buildPickUI(size_t localPickID) {

  ImGui::TextUnformatted(("#" + std::to_string(localPickID) + "  ").c_str());
  ImGui::SameLine();
  ImGui::TextUnformatted(to_string(points[localPickID]).c_str());

  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Indent(20.);

  // Build GUI to show the quantities
  ImGui::Columns(2);
  ImGui::SetColumnWidth(0, ImGui::GetWindowWidth() / 3);
  for (auto& x : quantities) {
    x.second->buildPickUI(localPickID);
  }

  ImGui::Indent(-20.);
}